

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O1

ClientMetric * __thiscall
prometheus::Family<prometheus::Counter>::CollectMetric
          (ClientMetric *__return_storage_ptr__,Family<prometheus::Counter> *this,
          Labels *metric_labels,Counter *metric)

{
  Counter::Collect(__return_storage_ptr__,metric);
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  reserve(&__return_storage_ptr__->label,
          (metric_labels->_M_t)._M_impl.super__Rb_tree_header._M_node_count +
          (this->constant_labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,prometheus::Family<prometheus::Counter>::CollectMetric(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,prometheus::Counter*)const::_lambda(std::pair<std::__cxx11::string,std::__cxx11::string>const&)_1_>
            ((this->constant_labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )&(this->constant_labels_)._M_t._M_impl.super__Rb_tree_header,
             (anon_class_8_1_85dc51e9)__return_storage_ptr__);
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,prometheus::Family<prometheus::Counter>::CollectMetric(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,prometheus::Counter*)const::_lambda(std::pair<std::__cxx11::string,std::__cxx11::string>const&)_1_>
            ((metric_labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )&(metric_labels->_M_t)._M_impl.super__Rb_tree_header,
             (anon_class_8_1_85dc51e9)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Family<T>::CollectMetric(const Labels& metric_labels,
                                      T* metric) const {
  auto collected = metric->Collect();
  collected.label.reserve(constant_labels_.size() + metric_labels.size());
  const auto add_label =
      [&collected](const std::pair<std::string, std::string>& label_pair) {
        auto label = ClientMetric::Label{};
        label.name = label_pair.first;
        label.value = label_pair.second;
        collected.label.push_back(std::move(label));
      };
  std::for_each(constant_labels_.cbegin(), constant_labels_.cend(), add_label);
  std::for_each(metric_labels.cbegin(), metric_labels.cend(), add_label);
  return collected;
}